

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_band.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  SUNMatrix A;
  N_Vector p_Var9;
  long lVar10;
  SUNLinearSolver S;
  uint uVar11;
  long lVar12;
  char *pcVar13;
  N_Vector b;
  SUNMatrix p_Var14;
  ulong uVar15;
  undefined8 uVar16;
  ulong uVar17;
  undefined8 uVar18;
  SUNContext sunctx;
  undefined8 local_80;
  SUNMatrix local_78;
  undefined8 local_70;
  undefined8 local_68;
  N_Vector local_60;
  N_Vector local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  iVar1 = SUNContext_Create(0,&local_80);
  if (iVar1 == 0) {
    if (argc < 5) {
      pcVar13 = 
      "ERROR: FOUR (4) Inputs required: matrix cols, matrix uband, matrix lband, print timing ";
    }
    else {
      uVar8 = atol(argv[1]);
      if ((long)uVar8 < 1) {
        pcVar13 = "ERROR: number of matrix columns must be a positive integer ";
      }
      else {
        local_78 = (SUNMatrix)atol(argv[2]);
        if ((long)local_78 < 1 || (long)uVar8 <= (long)local_78) {
          pcVar13 = 
          "ERROR: matrix upper bandwidth must be a positive integer, less than number of columns ";
        }
        else {
          local_50 = atol(argv[3]);
          if (0 < local_50 && local_50 < (long)uVar8) {
            iVar1 = atoi(argv[4]);
            SetTiming(iVar1);
            p_Var14 = local_78;
            uVar17 = 0;
            printf("\nBand linear solver test: size %ld, bandwidths %ld %ld\n\n",uVar8,local_78,
                   local_50);
            A = (SUNMatrix)SUNBandMatrix(uVar8,p_Var14,local_50,local_80);
            local_70 = SUNBandMatrix(uVar8,p_Var14,local_50,local_80);
            p_Var9 = (N_Vector)N_VNew_Serial(uVar8,local_80);
            local_68 = N_VNew_Serial(uVar8,local_80);
            local_58 = (N_Vector)N_VNew_Serial(uVar8,local_80);
            local_60 = p_Var9;
            local_38 = N_VGetArrayPointer(p_Var9);
            local_40 = uVar8 - 1;
            local_48 = local_40 - local_50;
            do {
              p_Var14 = (SUNMatrix)uVar17;
              if ((long)local_78 < (long)uVar17) {
                p_Var14 = local_78;
              }
              lVar10 = SUNBandMatrix_Column(A,uVar17);
              lVar12 = local_40 - uVar17;
              if ((long)uVar17 <= local_48) {
                lVar12 = local_50;
              }
              if (SBORROW8(lVar12,-(long)p_Var14) == lVar12 + (long)p_Var14 < 0) {
                uVar15 = ~(ulong)p_Var14;
                do {
                  iVar1 = rand();
                  *(double *)(lVar10 + 8 + uVar15 * 8) = (double)iVar1 / 2147483647.0;
                  uVar15 = uVar15 + 1;
                } while ((long)uVar15 < lVar12);
              }
              iVar1 = rand();
              *(double *)(local_38 + uVar17 * 8) = (double)iVar1 / 2147483647.0;
              uVar17 = uVar17 + 1;
            } while (uVar17 != uVar8);
            iVar1 = SUNMatScaleAddI(1.0 / (double)((long)local_78 + local_50 + 1),A);
            uVar18 = local_70;
            if (iVar1 == 0) {
              SUNMatCopy(A,local_70);
              p_Var9 = local_60;
              uVar16 = local_68;
              N_VScale(0x3ff0000000000000,local_60,local_68);
              b = local_58;
              iVar1 = SUNMatMatvec(A,p_Var9,local_58);
              if (iVar1 == 0) {
                S = (SUNLinearSolver)SUNLinSol_Band(p_Var9,A,local_80);
                if (S != (SUNLinearSolver)0x0) {
                  iVar1 = Test_SUNLinSolInitialize(S,0);
                  iVar2 = Test_SUNLinSolSetup(S,A,0);
                  local_78 = A;
                  iVar3 = Test_SUNLinSolSolve(S,A,p_Var9,b,2.220446049250313e-14,1,0);
                  iVar4 = Test_SUNLinSolGetType(S,SUNLINEARSOLVER_DIRECT,0);
                  iVar5 = Test_SUNLinSolGetID(S,SUNLINEARSOLVER_BAND,0);
                  iVar6 = Test_SUNLinSolLastFlag(S,0);
                  iVar7 = Test_SUNLinSolSpace(S,0);
                  uVar11 = iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + iVar1;
                  if (uVar11 == 0) {
                    puts("SUCCESS: SUNLinSol module passed all tests \n ");
                    uVar16 = local_68;
                    uVar18 = local_70;
                  }
                  else {
                    printf("FAIL: SUNLinSol module failed %i tests \n \n",(ulong)uVar11);
                    puts("\nA (original) =");
                    uVar18 = local_70;
                    SUNBandMatrix_Print(local_70,_stdout);
                    puts("\nA (factored) =");
                    SUNBandMatrix_Print(local_78,_stdout);
                    puts("\nx (original) =");
                    uVar16 = local_68;
                    N_VPrint_Serial(local_68);
                    puts("\nx (computed) =");
                    N_VPrint_Serial(p_Var9);
                  }
                  SUNLinSolFree(S);
                  SUNMatDestroy(local_78);
                  SUNMatDestroy(uVar18);
                  N_VDestroy(p_Var9);
                  N_VDestroy(uVar16);
                  N_VDestroy(b);
                  SUNContext_Free(&local_80);
                  return uVar11;
                }
                pcVar13 = "FAIL: SUNLinSol_Band returned NULL";
              }
              else {
                pcVar13 = "FAIL: SUNLinSol SUNMatMatvec failure";
              }
              puts(pcVar13);
              SUNMatDestroy(A);
              SUNMatDestroy(uVar18);
              N_VDestroy(p_Var9);
              N_VDestroy(uVar16);
            }
            else {
              puts("FAIL: SUNLinSol SUNMatScaleAddI failure");
              SUNMatDestroy(A);
              SUNMatDestroy(local_70);
              N_VDestroy(local_60);
              N_VDestroy(local_68);
              b = local_58;
            }
            N_VDestroy(b);
            return 1;
          }
          pcVar13 = 
          "ERROR: matrix lower bandwidth must be a positive integer, less than number of columns ";
        }
      }
    }
  }
  else {
    pcVar13 = "ERROR: SUNContext_Create failed";
  }
  puts(pcVar13);
  return -1;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails = 0;                   /* counter for test failures  */
  sunindextype cols, uband, lband; /* matrix columns, bandwidths */
  SUNLinearSolver LS;              /* solver object              */
  SUNMatrix A, B;                  /* test matrices              */
  N_Vector x, y, b;                /* test vectors               */
  int print_timing;
  sunindextype j, k, kstart, kend;
  sunrealtype *colj, *xdata;
  SUNContext sunctx;

  if (SUNContext_Create(SUN_COMM_NULL, &sunctx))
  {
    printf("ERROR: SUNContext_Create failed\n");
    return (-1);
  }

  /* check input and set matrix dimensions */
  if (argc < 5)
  {
    printf("ERROR: FOUR (4) Inputs required: matrix cols, matrix uband, matrix "
           "lband, print timing \n");
    return (-1);
  }

  cols = (sunindextype)atol(argv[1]);
  if (cols <= 0)
  {
    printf("ERROR: number of matrix columns must be a positive integer \n");
    return (-1);
  }

  uband = (sunindextype)atol(argv[2]);
  if ((uband <= 0) || (uband >= cols))
  {
    printf("ERROR: matrix upper bandwidth must be a positive integer, less "
           "than number of columns \n");
    return (-1);
  }

  lband = (sunindextype)atol(argv[3]);
  if ((lband <= 0) || (lband >= cols))
  {
    printf("ERROR: matrix lower bandwidth must be a positive integer, less "
           "than number of columns \n");
    return (-1);
  }

  print_timing = atoi(argv[4]);
  SetTiming(print_timing);

  printf("\nBand linear solver test: size %ld, bandwidths %ld %ld\n\n",
         (long int)cols, (long int)uband, (long int)lband);

  /* Create matrices and vectors */
  A = SUNBandMatrix(cols, uband, lband, sunctx);
  B = SUNBandMatrix(cols, uband, lband, sunctx);
  x = N_VNew_Serial(cols, sunctx);
  y = N_VNew_Serial(cols, sunctx);
  b = N_VNew_Serial(cols, sunctx);

  /* Fill matrix and x vector with uniform random data in [0,1] */
  xdata = N_VGetArrayPointer(x);
  for (j = 0; j < cols; j++)
  {
    /* A matrix column */
    colj   = SUNBandMatrix_Column(A, j);
    kstart = (j < uband) ? -j : -uband;
    kend   = (j > cols - 1 - lband) ? cols - 1 - j : lband;
    for (k = kstart; k <= kend; k++)
    {
      colj[k] = (sunrealtype)rand() / (sunrealtype)RAND_MAX;
    }

    /* x entry */
    xdata[j] = (sunrealtype)rand() / (sunrealtype)RAND_MAX;
  }

  /* Scale/shift matrix to ensure diagonal dominance */
  fails += SUNMatScaleAddI(ONE / (uband + lband + 1), A);
  if (fails)
  {
    printf("FAIL: SUNLinSol SUNMatScaleAddI failure\n");

    /* Free matrices and vectors */
    SUNMatDestroy(A);
    SUNMatDestroy(B);
    N_VDestroy(x);
    N_VDestroy(y);
    N_VDestroy(b);

    return (1);
  }

  /* copy A and x into B and y to print in case of solver failure */
  SUNMatCopy(A, B);
  N_VScale(ONE, x, y);

  /* create right-hand side vector for linear solve */
  fails = SUNMatMatvec(A, x, b);
  if (fails)
  {
    printf("FAIL: SUNLinSol SUNMatMatvec failure\n");

    /* Free matrices and vectors */
    SUNMatDestroy(A);
    SUNMatDestroy(B);
    N_VDestroy(x);
    N_VDestroy(y);
    N_VDestroy(b);

    return (1);
  }

  /* Create banded linear solver */
  LS = SUNLinSol_Band(x, A, sunctx);
  if (LS == NULL)
  {
    printf("FAIL: SUNLinSol_Band returned NULL\n");

    /* Free matrices and vectors */
    SUNMatDestroy(A);
    SUNMatDestroy(B);
    N_VDestroy(x);
    N_VDestroy(y);
    N_VDestroy(b);

    return (1);
  }

  /* Run Tests */
  fails += Test_SUNLinSolInitialize(LS, 0);
  fails += Test_SUNLinSolSetup(LS, A, 0);
  fails += Test_SUNLinSolSolve(LS, A, x, b, 100 * SUN_UNIT_ROUNDOFF, SUNTRUE, 0);

  fails += Test_SUNLinSolGetType(LS, SUNLINEARSOLVER_DIRECT, 0);
  fails += Test_SUNLinSolGetID(LS, SUNLINEARSOLVER_BAND, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolSpace(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol module failed %i tests \n \n", fails);
    printf("\nA (original) =\n");
    SUNBandMatrix_Print(B, stdout);
    printf("\nA (factored) =\n");
    SUNBandMatrix_Print(A, stdout);
    printf("\nx (original) =\n");
    N_VPrint_Serial(y);
    printf("\nx (computed) =\n");
    N_VPrint_Serial(x);
  }
  else { printf("SUCCESS: SUNLinSol module passed all tests \n \n"); }

  /* Free solver, matrix and vectors */
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNMatDestroy(B);
  N_VDestroy(x);
  N_VDestroy(y);
  N_VDestroy(b);
  SUNContext_Free(&sunctx);

  return (fails);
}